

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::
     vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
     ::object_mover(void *pDst_void,void *pSrc_void,uint num)

{
  elemental_vector *this;
  uint uVar1;
  long lVar2;
  bool bVar3;
  
  if (num != 0) {
    lVar2 = 0;
    do {
      bVar3 = *(char *)((long)pSrc_void + lVar2 + 0x1c) != '\0';
      if (bVar3) {
        this = (elemental_vector *)((long)pDst_void + lVar2);
        this->m_p = (void *)0x0;
        this->m_size = 0;
        this->m_capacity = 0;
        elemental_vector::increase_capacity
                  (this,*(uint *)((long)pSrc_void + lVar2 + 8),false,4,(object_mover)0x0,false);
        uVar1 = *(uint *)((long)pSrc_void + lVar2 + 8);
        *(uint *)((long)pDst_void + lVar2 + 8) = uVar1;
        memcpy(*(void **)((long)pDst_void + lVar2),*(void **)((long)pSrc_void + lVar2),
               (ulong)uVar1 << 2);
        *(undefined8 *)((long)pDst_void + lVar2 + 0x10) =
             *(undefined8 *)((long)pSrc_void + lVar2 + 0x10);
        *(undefined4 *)((long)pDst_void + lVar2 + 0x18) =
             *(undefined4 *)((long)pSrc_void + lVar2 + 0x18);
      }
      *(bool *)((long)pDst_void + lVar2 + 0x1c) = bVar3;
      if ((*(char *)((long)pSrc_void + lVar2 + 0x1c) != '\0') &&
         (*(void **)((long)pSrc_void + lVar2) != (void *)0x0)) {
        crnlib_free(*(void **)((long)pSrc_void + lVar2));
      }
      lVar2 = lVar2 + 0x20;
    } while ((ulong)num << 5 != lVar2);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }